

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::PhraseTests_SpanIndices_Test::TestBody(PhraseTests_SpanIndices_Test *this)

{
  long lVar1;
  char *pcVar2;
  int i;
  ulong uVar3;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  AssertHelper local_68;
  AssertionResult gtest_ar;
  Span s;
  Indices is;
  
  s.start = 0;
  s.end = 3;
  Span::indices(&is,&s);
  local_68.data_._0_4_ = 3;
  local_70.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)is.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)is.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
              _M_start >> 1);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"3","is.size()",(int *)&local_68,(unsigned_long *)&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x60,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    lVar1 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)is.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)is.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                              super__Vector_impl_data._M_start >> 1); uVar3 = uVar3 + 1) {
      local_70.ptr_._0_4_ = (int)s.start + (int)uVar3;
      testing::internal::CmpHelperEQ<int,short>
                ((internal *)&gtest_ar,"s.start + i","is[i]",(int *)&local_70,
                 (short *)((long)is.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar1));
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_70);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                   ,0x62,pcVar2);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_70);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      lVar1 = lVar1 + 2;
    }
  }
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base
            (&is.super__Vector_base<short,_std::allocator<short>_>);
  return;
}

Assistant:

TEST(PhraseTests, SpanIndices) {
  Span s{0, 3};
  auto is = s.indices();
  ASSERT_EQ(3, is.size());
  for (int i = 0; i < is.size(); i++) {
    EXPECT_EQ(s.start + i, is[i]);
  }
}